

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_proxy.c
# Opt level: O3

int main(void)

{
  uint uVar1;
  long lVar2;
  uint8_t response [16];
  uint8_t local_18 [16];
  
  local_18[0] = '\0';
  local_18[1] = '\0';
  local_18[2] = '\0';
  local_18[3] = '\0';
  local_18[4] = '\0';
  local_18[5] = '\0';
  local_18[6] = '\0';
  local_18[7] = '\0';
  local_18[8] = '\0';
  local_18[9] = '\0';
  local_18[10] = '\0';
  local_18[0xb] = '\0';
  local_18[0xc] = '\0';
  local_18[0xd] = '\0';
  local_18[0xe] = '\0';
  local_18[0xf] = '\0';
  uVar1 = get_password_response(0x4d3b6d47,test_proxy_password_response_password,local_18);
  if (uVar1 == 0) {
    lVar2 = 0;
    do {
      if ((&DAT_00108010)[lVar2] != local_18[lVar2]) {
        fprintf(_stderr,
                "Error: Password response value missmatch at index %lu. Expected 0x%02hx, got 0x%02hx\n"
               );
        return -0x16;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x10);
    uVar1 = 0;
  }
  else {
    fprintf(_stderr,"Error: get_password_response returned %d\n",(ulong)uVar1);
  }
  return uVar1;
}

Assistant:

static int test_proxy_password_response(void)
{
	const uint32_t nonce = 0x4d3b6d47;
	static const char password[] = "asdf1234";
	const uint8_t expected_response[16] = {
		0x0c, 0x0b, 0xb9, 0x83, 0x5f, 0x31, 0x95, 0x53,
		0x10, 0x4b, 0xf9, 0x10, 0xfb, 0x72, 0x45, 0xec,
	};
	uint8_t response[16] = { 0x00 };
	int ret;
	size_t i;

	ret = get_password_response(nonce, password, response);
	if (ret != 0) {
		fprintf(stderr, "Error: get_password_response returned %d\n",
			ret);
		return ret;
	}

	for (i = 0; i < 16; i++) {
		if (expected_response[i] != response[i]) {
			fprintf(stderr,
				"Error: Password response value missmatch at index %lu. Expected 0x%02hx, got 0x%02hx\n",
				(unsigned long)i, (uint16_t)expected_response[i], (uint16_t)response[i]);
			return -EINVAL;
		}
	}

	return ret;
}